

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall kj::parse::anon_unknown_0::TestCase362::run(TestCase362 *this)

{
  char *pcVar1;
  int iVar2;
  anon_union_16_1_a8c68091_for_NullableValue<kj::StringPtr>_2 *params_2;
  anon_union_16_1_a8c68091_for_NullableValue<kj::StringPtr>_2 *params_2_00;
  Input input;
  Maybe<kj::StringPtr> result;
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:367:17)>_>
  parser;
  IteratorInput<char,_const_char_*> local_80;
  AddFailureAdapter local_60;
  Maybe<kj::StringPtr> local_48;
  undefined8 local_30 [2];
  
  local_30[0] = 0x72616200006f6f66;
  local_80.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_80.pos = "foo";
  local_80.end = "";
  local_80.best = "foo";
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()(&local_48,
               (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                *)local_30,&local_80);
  params_2 = &local_48.ptr.field_1;
  params_2_00 = (anon_union_16_1_a8c68091_for_NullableValue<kj::StringPtr>_2 *)0x0;
  if (local_48.ptr.isSet != false) {
    params_2_00 = params_2;
  }
  if (local_48.ptr.isSet == true) {
    if (((local_48.ptr.field_1.value.content.size_ != 4) ||
        (iVar2 = bcmp((params_2_00->value).content.ptr,"foo",3), iVar2 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x176,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (*s)\", \"foo\", *s",
                 (char (*) [33])"failed: expected (\"foo\") == (*s)",(char (*) [4])0x3a5188,
                 &params_2_00->value);
    }
  }
  else {
    local_60.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_60.line = 0x178;
    local_60.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[26]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x178,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [26])"Expected \'foo\', got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_60);
  }
  pcVar1 = local_80.pos;
  if ((local_80.pos != local_80.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x17a,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_80.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_80.best < pcVar1) {
      local_80.best = pcVar1;
    }
    if (local_80.best <= (local_80.parent)->best) {
      local_80.best = (local_80.parent)->best;
    }
    (local_80.parent)->best = local_80.best;
  }
  local_80.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_80.pos = "bar";
  local_80.end = "";
  local_80.best = "bar";
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()(&local_48,
               (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                *)local_30,&local_80);
  if (local_48.ptr.isSet == false) {
    params_2 = (anon_union_16_1_a8c68091_for_NullableValue<kj::StringPtr>_2 *)0x0;
  }
  if (local_48.ptr.isSet == true) {
    if (((local_48.ptr.field_1.value.content.size_ != 4) ||
        (iVar2 = bcmp((params_2->value).content.ptr,"bar",3), iVar2 != 0)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x182,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (*s)\", \"bar\", *s",
                 (char (*) [33])"failed: expected (\"bar\") == (*s)",(char (*) [4])0x3892c8,
                 &params_2->value);
    }
  }
  else {
    local_60.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_60.line = 0x184;
    local_60.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[26]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x184,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [26])"Expected \'bar\', got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_60);
  }
  pcVar1 = local_80.pos;
  if ((local_80.pos != local_80.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x186,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if (local_80.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_80.best < pcVar1) {
      local_80.best = pcVar1;
    }
    if (local_80.best <= (local_80.parent)->best) {
      local_80.best = (local_80.parent)->best;
    }
    (local_80.parent)->best = local_80.best;
  }
  return;
}

Assistant:

TEST(CommonParsers, OneOfParser) {
  auto parser = oneOf(
      transform(sequence(exactly('f'), exactly('o'), exactly('o')),
                []() -> StringPtr { return "foo"; }),
      transform(sequence(exactly('b'), exactly('a'), exactly('r')),
                []() -> StringPtr { return "bar"; }));

  {
    StringPtr text = "foo";
    Input input(text.begin(), text.end());
    Maybe<StringPtr> result = parser(input);
    KJ_IF_MAYBE(s, result) {
      EXPECT_EQ("foo", *s);
    } else {
      ADD_FAILURE() << "Expected 'foo', got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }